

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptor::FindEnumValueByName(FileDescriptor *this,string *key)

{
  __node_ptr p_Var1;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  EnumValueDescriptor *pEVar5;
  char cVar6;
  key_type local_18;
  
  local_18.second = (key->_M_dataplus)._M_p;
  cVar6 = *local_18.second;
  if (cVar6 == '\0') {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    pcVar3 = local_18.second;
    do {
      pcVar3 = pcVar3 + 1;
      uVar4 = (long)cVar6 + uVar4 * 5;
      cVar6 = *pcVar3;
    } while (cVar6 != '\0');
  }
  uVar4 = (long)this * 0x1000193 ^ uVar4;
  local_18.first = this;
  p_Var1 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(*(_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            **)(this + 0x90),
                          uVar4 % (*(_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                     **)(this + 0x90))->_M_bucket_count,&local_18,uVar4);
  piVar2 = (int *)((long)&(p_Var1->
                          super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                          ._M_storage._M_storage + 0x10);
  if (p_Var1 == (__node_ptr)0x0) {
    piVar2 = &(anonymous_namespace)::kNullSymbol;
  }
  pEVar5 = (EnumValueDescriptor *)0x0;
  if ((anonymous_namespace)::kNullSymbol != 0) {
    pEVar5 = DAT_007ee490;
  }
  if (*piVar2 == 5) {
    pEVar5 = *(EnumValueDescriptor **)(piVar2 + 2);
  }
  return pEVar5;
}

Assistant:

const EnumValueDescriptor* FileDescriptor::FindEnumValueByName(
    const std::string& key) const {
  Symbol result =
      tables_->FindNestedSymbolOfType(this, key, Symbol::ENUM_VALUE);
  if (!result.IsNull()) {
    return result.enum_value_descriptor;
  } else {
    return nullptr;
  }
}